

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTransform.h
# Opt level: O3

ChVector<double> *
chrono::ChTransform<double>::TransformLocalToParent
          (ChVector<double> *local,ChVector<double> *origin,ChQuaternion<double> *alignment)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  ChVector<double> *in_RDI;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  dVar1 = alignment->m_data[0];
  dVar2 = alignment->m_data[1];
  auVar12 = ZEXT816(0x4000000000000000);
  dVar3 = alignment->m_data[2];
  dVar4 = alignment->m_data[3];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local->m_data[0];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local->m_data[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local->m_data[2];
  dVar7 = dVar1 * dVar1;
  dVar8 = dVar2 * dVar3 - dVar1 * dVar4;
  dVar6 = dVar2 * dVar3 + dVar1 * dVar4;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar7 + dVar2 * dVar2;
  auVar9 = vfmadd213sd_avx512f(auVar15,auVar12,ZEXT816(0xbff0000000000000));
  auVar5._8_8_ = 0;
  auVar5._0_8_ = origin->m_data[0];
  auVar5 = vfmadd213sd_fma(auVar9,auVar19,auVar5);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = origin->m_data[1];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar6 + dVar6;
  auVar9 = vfmadd213sd_fma(auVar11,auVar19,auVar9);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar7 + dVar3 * dVar3;
  auVar10 = vfmadd213sd_avx512f(auVar18,auVar12,ZEXT816(0xbff0000000000000));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar7 + dVar4 * dVar4;
  auVar11 = vfmadd213sd_avx512f(auVar14,auVar12,ZEXT816(0xbff0000000000000));
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar8 + dVar8;
  auVar5 = vfmadd213sd_fma(auVar21,auVar20,auVar5);
  dVar6 = dVar1 * dVar3 + dVar2 * dVar4;
  dVar7 = dVar2 * dVar4 - dVar1 * dVar3;
  auVar9 = vfmadd213sd_fma(auVar10,auVar20,auVar9);
  dVar8 = dVar3 * dVar4 - dVar1 * dVar2;
  dVar1 = dVar1 * dVar2 + dVar3 * dVar4;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = origin->m_data[2];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar7 + dVar7;
  auVar10 = vfmadd213sd_fma(auVar13,auVar19,auVar10);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar6 + dVar6;
  auVar5 = vfmadd213sd_fma(auVar16,auVar22,auVar5);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar8 + dVar8;
  auVar9 = vfmadd213sd_fma(auVar12,auVar22,auVar9);
  in_RDI->m_data[0] = auVar5._0_8_;
  in_RDI->m_data[1] = auVar9._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1 + dVar1;
  auVar5 = vfmadd213sd_fma(auVar17,auVar20,auVar10);
  auVar5 = vfmadd213sd_fma(auVar11,auVar22,auVar5);
  in_RDI->m_data[2] = auVar5._0_8_;
  return in_RDI;
}

Assistant:

static ChVector<Real> TransformLocalToParent(
        const ChVector<Real>& local,         ///< point to transform, given in local coordinates
        const ChVector<Real>& origin,        ///< origin of frame respect to parent, in parent coords,
        const ChQuaternion<Real>& alignment  ///< rotation of frame respect to parent, in parent coords.
        ) {
        // It could be simply: "return origin+alignment.Rotate(local);"
        // but for faster execution, do this:
        Real e0e0 = alignment.e0() * alignment.e0();
        Real e1e1 = alignment.e1() * alignment.e1();
        Real e2e2 = alignment.e2() * alignment.e2();
        Real e3e3 = alignment.e3() * alignment.e3();
        Real e0e1 = alignment.e0() * alignment.e1();
        Real e0e2 = alignment.e0() * alignment.e2();
        Real e0e3 = alignment.e0() * alignment.e3();
        Real e1e2 = alignment.e1() * alignment.e2();
        Real e1e3 = alignment.e1() * alignment.e3();
        Real e2e3 = alignment.e2() * alignment.e3();
        return ChVector<Real>(origin.x() + ((e0e0 + e1e1) * 2. - 1.) * local.x() + ((e1e2 - e0e3) * 2.) * local.y() +
                                  ((e1e3 + e0e2) * 2.) * local.z(),
                              origin.y() + ((e1e2 + e0e3) * 2.) * local.x() + ((e0e0 + e2e2) * 2. - 1.) * local.y() +
                                  ((e2e3 - e0e1) * 2.) * local.z(),
                              origin.z() + ((e1e3 - e0e2) * 2.) * local.x() + ((e2e3 + e0e1) * 2.) * local.y() +
                                  ((e0e0 + e3e3) * 2. - 1.) * local.z());
    }